

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# methods.cpp
# Opt level: O1

transformation_t *
opengv::absolute_pose::gpnp
          (transformation_t *__return_storage_ptr__,AbsoluteAdapterBase *adapter,Indices *indices)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  size_t sVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  undefined8 uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  double dVar14;
  double dVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  transformation_t *ptVar22;
  int iVar23;
  PointerType ptr;
  undefined8 *puVar24;
  Index size;
  double *pdVar25;
  long lVar26;
  long *plVar27;
  ulong uVar28;
  double *pdVar29;
  ulong uVar30;
  size_t sVar31;
  ulong uVar32;
  long lVar33;
  int iVar34;
  ulong uVar35;
  ulong uVar36;
  long lVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [64];
  double dVar40;
  double dVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 in_ZMM1 [64];
  double dVar47;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  double dVar52;
  undefined1 auVar53 [16];
  point_t c0;
  points_t c;
  MatrixXd p;
  MatrixXd D;
  MatrixXd weights;
  MatrixXd A;
  MatrixXd V;
  MatrixXd invD;
  MatrixXd b;
  MatrixXd pinvA;
  Matrix<double,_12,_1,_0,_12,_1> a;
  rotation_t camRotation;
  JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> SVD2;
  JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> SVD;
  Matrix<double,_3,_1,_0,_3,_1> local_b30;
  points_t local_b10;
  undefined1 local_af0 [16];
  Index local_ae0;
  DenseStorage<double,__1,__1,__1,_0> local_ad0;
  DenseStorage<double,__1,__1,__1,_0> local_ab0;
  undefined1 local_a90 [16];
  double local_a78;
  transformation_t *local_a70;
  MatrixType local_a68;
  DenseStorage<double,__1,__1,__1,_0> local_a50;
  long *local_a38;
  long local_a30;
  Matrix<double,__1,__1,_0,__1,__1> local_a20;
  Matrix<double,__1,__1,_0,__1,__1> local_a08;
  double local_9f0;
  double dStack_9e8;
  double local_9e0;
  double dStack_9d8;
  undefined1 local_9d0 [16];
  double local_9c0;
  double dStack_9b8;
  double local_9b0;
  double dStack_9a8;
  Matrix<double,_12,_1,_0,_12,_1> local_9a0;
  Matrix<double,_12,_12,_0,_12,_12> local_940;
  JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> local_4b8;
  JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> local_298;
  
  auVar38 = in_ZMM1._0_16_;
  local_b30.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array.
  _0_16_ = ZEXT816(0);
  local_b30.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       0.0;
  uVar36 = indices->_numberCorrespondences;
  local_a70 = __return_storage_ptr__;
  if (uVar36 != 0) {
    lVar33 = 0;
    uVar35 = 0;
    do {
      if (indices->_useIndices == false) {
        iVar34 = (int)uVar35;
      }
      else {
        iVar34 = *(int *)((long)(indices->_indices->super__Vector_base<int,_std::allocator<int>_>).
                                _M_impl.super__Vector_impl_data._M_start + (lVar33 >> 0x1e));
      }
      (*adapter->_vptr_AbsoluteAdapterBase[6])(&local_940,adapter,(long)iVar34);
      auVar38 = in_ZMM1._0_16_;
      local_b30.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [1] = local_b30.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
            array[1] +
            local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.
            m_data.array[1];
      local_b30.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [0] = local_b30.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
            array[0] +
            local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.
            m_data.array[0];
      local_b30.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
      [2] = local_b30.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
            array[2] +
            local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.
            m_data.array[2];
      uVar35 = uVar35 + 1;
      uVar36 = indices->_numberCorrespondences;
      lVar33 = lVar33 + 0x100000000;
    } while (uVar35 < uVar36);
  }
  auVar38 = vcvtusi2sd_avx512f(auVar38,uVar36);
  dVar40 = auVar38._0_8_;
  auVar38._8_8_ = dVar40;
  auVar38._0_8_ = dVar40;
  local_b30.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array.
  _0_16_ = vdivpd_avx((undefined1  [16])
                      local_b30.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                      m_storage.m_data.array._0_16_,auVar38);
  local_b30.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       local_b30.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
       [2] / dVar40;
  local_af0 = ZEXT816(0);
  local_ae0 = 0;
  if ((uVar36 != 0) &&
     (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816((long)uVar36),0) < 3)) {
    puVar24 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar24 = srand;
    __cxa_throw(puVar24,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
            ((DenseStorage<double,__1,__1,__1,_0> *)local_af0,uVar36 * 3,3,uVar36);
  if (indices->_numberCorrespondences != 0) {
    lVar33 = 0;
    uVar36 = 0;
    do {
      iVar34 = (int)uVar36;
      if (indices->_useIndices == true) {
        iVar34 = (indices->_indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start[iVar34];
      }
      (*adapter->_vptr_AbsoluteAdapterBase[6])(&local_940,adapter,(long)iVar34);
      uVar35 = local_af0._8_8_;
      if ((((ulong)(local_af0._0_8_ + local_af0._8_8_ * uVar36 * 8) & 7) == 0) &&
         (uVar35 = (ulong)(-((uint)((ulong)(local_af0._0_8_ + local_af0._8_8_ * uVar36 * 8) >> 3) &
                            0x1fffffff) & 7), (long)local_af0._8_8_ <= (long)uVar35)) {
        uVar35 = local_af0._8_8_;
      }
      uVar30 = local_af0._8_8_ - uVar35;
      uVar28 = uVar30 + 7;
      if (-1 < (long)uVar30) {
        uVar28 = uVar30;
      }
      if (0 < (long)uVar35) {
        uVar32 = 0;
        do {
          *(double *)(local_af0._0_8_ + uVar32 * 8 + local_af0._8_8_ * lVar33) =
               local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.
               m_data.array[uVar32] -
               local_b30.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
               m_data.array[uVar32];
          uVar32 = uVar32 + 1;
        } while (uVar35 != uVar32);
      }
      uVar28 = (uVar28 & 0xfffffffffffffff8) + uVar35;
      if (7 < (long)uVar30) {
        do {
          auVar39 = vsubpd_avx512f(*(undefined1 (*) [64])
                                    (local_940.
                                     super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>
                                     .m_storage.m_data.array + uVar35),
                                   *(undefined1 (*) [64])
                                    (local_b30.
                                     super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                     m_storage.m_data.array + uVar35));
          *(undefined1 (*) [64])(local_af0._0_8_ + uVar35 * 8 + local_af0._8_8_ * lVar33) = auVar39;
          uVar35 = uVar35 + 8;
        } while ((long)uVar35 < (long)uVar28);
      }
      if ((long)uVar28 < (long)local_af0._8_8_) {
        do {
          *(double *)(local_af0._0_8_ + uVar28 * 8 + local_af0._8_8_ * lVar33) =
               local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.
               m_data.array[uVar28] -
               local_b30.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
               m_data.array[uVar28];
          uVar28 = uVar28 + 1;
        } while (local_af0._8_8_ != uVar28);
      }
      uVar36 = uVar36 + 1;
      lVar33 = lVar33 + 8;
    } while (uVar36 < indices->_numberCorrespondences);
  }
  Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>::JacobiSVD
            (&local_298,(MatrixType *)local_af0,0x28);
  local_b10.
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b10.
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (Matrix<double,_3,_1,_0,_3,_1> *)0x0;
  local_b10.
  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (Matrix<double,_3,_1,_0,_3,_1> *)0x0;
  std::
  vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
  ::_M_realloc_insert<Eigen::Matrix<double,3,1,0,3,1>const&>
            ((vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
              *)&local_b10,(iterator)0x0,&local_b30);
  auVar11._8_8_ = 0x402e000000000000;
  auVar11._0_8_ = 0x402e000000000000;
  auVar38 = vmulpd_avx512vl(*(undefined1 (*) [16])
                             local_298.
                             super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>
                             .m_matrixU.
                             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                             m_storage.m_data,auVar11);
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0] = auVar38._0_8_ +
        local_b30.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[0];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [1] = auVar38._8_8_ +
        local_b30.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[1];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [2] = *(double *)
         *(undefined1 (*) [16])
          ((long)local_298.
                 super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                 m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_data + 0x10) * 15.0 +
        local_b30.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[2];
  if (local_b10.
      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_b10.
      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
    ::_M_realloc_insert<Eigen::Matrix<double,3,1,0,3,1>>
              ((vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
                *)&local_b10,
               (iterator)
               local_b10.
               super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,
               (Matrix<double,_3,_1,_0,_3,_1> *)&local_940);
  }
  else {
    ((local_b10.
      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)->
    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array[2] =
         local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data
         .array[2];
    ((local_b10.
      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)->
    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array[0] =
         local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data
         .array[0];
    ((local_b10.
      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)->
    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array[1] =
         local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data
         .array[1];
    local_b10.
    super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_b10.
         super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
  }
  auVar12._8_8_ = 0x402e000000000000;
  auVar12._0_8_ = 0x402e000000000000;
  auVar38 = vmulpd_avx512vl(*(undefined1 (*) [16])
                             ((undefined1 *)
                              local_298.
                              super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>
                              .m_matrixU.
                              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                              m_storage.m_data +
                             local_298.
                             super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>
                             .m_matrixU.
                             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                             m_storage.m_rows * 8),auVar12);
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0] = auVar38._0_8_ +
        local_b30.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[0];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [1] = auVar38._8_8_ +
        local_b30.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[1];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [2] = *(double *)
         (*(undefined1 (*) [16])
           ((long)local_298.
                  super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                  m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_data + 0x10) +
         local_298.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
         m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows
         * 8) * 15.0 +
        local_b30.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[2];
  if (local_b10.
      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_b10.
      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
    ::_M_realloc_insert<Eigen::Matrix<double,3,1,0,3,1>>
              ((vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
                *)&local_b10,
               (iterator)
               local_b10.
               super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,
               (Matrix<double,_3,_1,_0,_3,_1> *)&local_940);
  }
  else {
    ((local_b10.
      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)->
    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array[2] =
         local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data
         .array[2];
    ((local_b10.
      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)->
    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array[0] =
         local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data
         .array[0];
    ((local_b10.
      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)->
    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array[1] =
         local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data
         .array[1];
    local_b10.
    super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_b10.
         super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
  }
  auVar13._8_8_ = 0x402e000000000000;
  auVar13._0_8_ = 0x402e000000000000;
  auVar38 = vmulpd_avx512vl(*(undefined1 (*) [16])
                             ((long)local_298.
                                    super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>
                                    .m_matrixU.
                                    super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                    .m_storage.m_data +
                             local_298.
                             super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>
                             .m_matrixU.
                             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                             m_storage.m_rows * 0x10),auVar13);
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0] = auVar38._0_8_ +
        local_b30.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[0];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [1] = auVar38._8_8_ +
        local_b30.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[1];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [2] = *(double *)
         *(undefined1 (*) [16])
          ((long)local_298.
                 super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                 m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_data +
          (local_298.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
           m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_rows + 1) * 0x10) * 15.0 +
        local_b30.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
        array[2];
  if (local_b10.
      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      local_b10.
      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
    ::_M_realloc_insert<Eigen::Matrix<double,3,1,0,3,1>>
              ((vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
                *)&local_b10,
               (iterator)
               local_b10.
               super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,
               (Matrix<double,_3,_1,_0,_3,_1> *)&local_940);
  }
  else {
    ((local_b10.
      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)->
    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array[2] =
         local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data
         .array[2];
    ((local_b10.
      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)->
    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array[0] =
         local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data
         .array[0];
    ((local_b10.
      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)->
    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array[1] =
         local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data
         .array[1];
    local_b10.
    super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_b10.
         super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
  }
  local_9e0 = local_b10.
              super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              ._M_impl.super__Vector_impl_data._M_start[1].
              super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
  ;
  dStack_9d8 = local_b10.
               super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
               ._M_impl.super__Vector_impl_data._M_start[1].
               super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
               [1];
  local_a90._0_8_ =
       local_b30.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
       [0];
  local_a90._8_8_ =
       local_b30.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
       [1];
  local_9f0 = local_b10.
              super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              ._M_impl.super__Vector_impl_data._M_start[2].
              super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
  ;
  dStack_9e8 = local_b10.
               super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
               ._M_impl.super__Vector_impl_data._M_start[2].
               super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
               [1];
  auVar42._8_8_ = 0;
  auVar42._0_8_ =
       local_b10.
       super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
       ._M_impl.super__Vector_impl_data._M_start[1].
       super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2];
  local_9d0 = vmovhps_avx(auVar42,local_b10.
                                  super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[2].
                                  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                  m_storage.m_data.array[2]);
  local_9b0 = local_b30.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
              m_data.array[2];
  dStack_9a8 = local_b30.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
               m_data.array[2];
  local_9c0 = local_b10.
              super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              ._M_impl.super__Vector_impl_data._M_start[3].
              super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
  ;
  dStack_9b8 = local_b10.
               super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
               ._M_impl.super__Vector_impl_data._M_start[3].
               super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
               [1];
  local_a78 = local_b10.
              super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              ._M_impl.super__Vector_impl_data._M_start[3].
              super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
  ;
  sVar3 = indices->_numberCorrespondences;
  local_ab0.m_data = (double *)0x0;
  local_ab0.m_rows = 0;
  local_ab0.m_cols = 0;
  if ((sVar3 != 0) &&
     (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816((long)sVar3),0) < 4)) {
    puVar24 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar24 = srand;
    __cxa_throw(puVar24,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_ab0,sVar3 * 4,4,sVar3);
  sVar3 = indices->_numberCorrespondences;
  if (sVar3 != 0) {
    auVar17._8_8_ = dStack_9d8;
    auVar17._0_8_ = local_9e0;
    auVar38 = vsubpd_avx(auVar17,local_a90);
    dVar40 = auVar38._0_8_;
    dVar5 = auVar38._8_8_;
    auVar16._8_8_ = dStack_9e8;
    auVar16._0_8_ = local_9f0;
    auVar38 = vsubpd_avx(auVar16,local_a90);
    dVar41 = auVar38._0_8_;
    dVar6 = auVar38._8_8_;
    auVar19._8_8_ = dStack_9a8;
    auVar19._0_8_ = local_9b0;
    auVar38 = vsubpd_avx(local_9d0,auVar19);
    dVar47 = auVar38._0_8_;
    dVar7 = auVar38._8_8_;
    auVar50._0_8_ = dVar40 * dVar40 + dVar5 * dVar5 + dVar47 * dVar47;
    auVar50._8_8_ = dVar41 * dVar41 + dVar6 * dVar6 + dVar7 * dVar7;
    auVar18._8_8_ = dStack_9b8;
    auVar18._0_8_ = local_9c0;
    auVar38 = vsubpd_avx(auVar18,local_a90);
    dVar4 = auVar38._0_8_;
    dVar8 = auVar38._8_8_;
    dVar9 = local_a78 - local_9b0;
    pdVar25 = (double *)(local_af0._0_8_ + 0x10);
    pdVar29 = local_ab0.m_data;
    sVar31 = sVar3;
    do {
      dVar14 = pdVar25[-2];
      dVar15 = pdVar25[-1];
      dVar52 = *pdVar25;
      auVar53._0_8_ = dVar52 * dVar47 + dVar14 * dVar40 + dVar15 * dVar5;
      auVar53._8_8_ = dVar52 * dVar7 + dVar14 * dVar41 + dVar15 * dVar6;
      auVar38 = vdivpd_avx(auVar53,auVar50);
      *(undefined1 (*) [16])(pdVar29 + 1) = auVar38;
      dVar52 = (dVar52 * dVar9 + dVar14 * dVar4 + dVar15 * dVar8) /
               (dVar9 * dVar9 + dVar4 * dVar4 + dVar8 * dVar8);
      pdVar29[3] = dVar52;
      *pdVar29 = 1.0 - (dVar52 + auVar38._0_8_ + auVar38._8_8_);
      pdVar25 = pdVar25 + local_af0._8_8_;
      pdVar29 = pdVar29 + local_ab0.m_rows;
      sVar31 = sVar31 - 1;
    } while (sVar31 != 0);
  }
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0] = (double)(sVar3 * 2);
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [1] = 5.92878775009496e-323;
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [2] = 0.0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_a68,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)&local_940);
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0] = (double)(indices->_numberCorrespondences * 2);
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [1] = 4.94065645841247e-324;
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [2] = 0.0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_a20,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)&local_940);
  if (indices->_numberCorrespondences != 0) {
    lVar33 = 8;
    lVar37 = 0;
    local_a90._8_8_ = 0x8000000000000000;
    local_a90._0_8_ = 0x8000000000000000;
    uVar36 = 0;
    do {
      iVar34 = (int)uVar36;
      lVar26 = lVar37 >> 0x1e;
      iVar23 = iVar34;
      if (indices->_useIndices != false) {
        iVar23 = *(int *)((long)(indices->_indices->super__Vector_base<int,_std::allocator<int>_>).
                                _M_impl.super__Vector_impl_data._M_start + lVar26);
      }
      (*adapter->_vptr_AbsoluteAdapterBase[4])(&local_4b8,adapter,(long)iVar23);
      iVar23 = iVar34;
      if (indices->_useIndices != false) {
        iVar23 = *(int *)((long)(indices->_indices->super__Vector_base<int,_std::allocator<int>_>).
                                _M_impl.super__Vector_impl_data._M_start + lVar26);
      }
      (*adapter->_vptr_AbsoluteAdapterBase[5])(&local_940,adapter,(long)iVar23);
      if (indices->_useIndices != false) {
        iVar34 = *(int *)((long)(indices->_indices->super__Vector_base<int,_std::allocator<int>_>).
                                _M_impl.super__Vector_impl_data._M_start + lVar26);
      }
      (*adapter->_vptr_AbsoluteAdapterBase[2])(&local_9a0,adapter,(long)iVar34);
      auVar43._0_8_ =
           local_9a0.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data
           .array[0] *
           local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.
           m_data.array[0];
      auVar43._8_8_ =
           local_9a0.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data
           .array[0] *
           local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.
           m_data.array[1];
      auVar48._8_8_ =
           local_9a0.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data
           .array[1];
      auVar48._0_8_ =
           local_9a0.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data
           .array[1];
      auVar20._8_8_ =
           local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.
           m_data.array[4];
      auVar20._0_8_ =
           local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.
           m_data.array[3];
      auVar38 = vfmadd231pd_fma(auVar43,auVar48,auVar20);
      auVar51._8_8_ =
           local_9a0.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data
           .array[2];
      auVar51._0_8_ =
           local_9a0.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.m_data
           .array[2];
      auVar21._8_8_ =
           local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.
           m_data.array[7];
      auVar21._0_8_ =
           local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.
           m_data.array[6];
      auVar38 = vfmadd231pd_fma(auVar38,auVar51,auVar21);
      dVar40 = local_9a0.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.
               m_data.array[0] *
               local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.
               m_data.array[2] +
               local_9a0.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.
               m_data.array[1] *
               local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.
               m_data.array[5] +
               local_9a0.super_PlainObjectBase<Eigen::Matrix<double,_12,_1,_0,_12,_1>_>.m_storage.
               m_data.array[2] *
               local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.
               m_data.array[8];
      lVar26 = local_ab0.m_rows * uVar36;
      *(double *)
       ((long)local_a68.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_data + lVar33 + -8) = dVar40 * local_ab0.m_data[lVar26];
      dVar41 = auVar38._0_8_;
      *(double *)
       ((long)local_a68.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_data +
       local_a68.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows *
       0x10 + -8 + lVar33) = dVar41 * (double)((ulong)local_ab0.m_data[lVar26] ^ local_a90._0_8_);
      *(double *)
       ((long)local_a68.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_data +
       local_a68.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows *
       0x18 + lVar33 + -8) = dVar40 * local_ab0.m_data[lVar26 + 1];
      *(double *)
       ((long)local_a68.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_data +
       local_a68.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows *
       0x28 + lVar33 + -8) =
           dVar41 * (double)((ulong)local_ab0.m_data[lVar26 + 1] ^ local_a90._0_8_);
      *(double *)
       ((long)local_a68.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_data +
       local_a68.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows *
       0x30 + -8 + lVar33) = dVar40 * local_ab0.m_data[lVar26 + 2];
      *(double *)
       ((long)local_a68.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_data +
       local_a68.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows *
       0x40 + -8 + lVar33) =
           dVar41 * (double)((ulong)local_ab0.m_data[lVar26 + 2] ^ local_a90._0_8_);
      *(double *)
       ((long)local_a68.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_data +
       local_a68.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows *
       0x48 + lVar33 + -8) = dVar40 * local_ab0.m_data[lVar26 + 3];
      *(double *)
       ((long)local_a68.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_data +
       local_a68.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows *
       0x58 + -8 + lVar33) =
           dVar41 * (double)((ulong)local_ab0.m_data[lVar26 + 3] ^ local_a90._0_8_);
      *(double *)
       ((long)local_a68.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_data +
       local_a68.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows *
       8 + lVar33) = dVar40 * local_ab0.m_data[lVar26];
      auVar38 = vshufpd_avx(auVar38,auVar38,1);
      dVar47 = auVar38._0_8_;
      *(double *)
       ((long)local_a68.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_data +
       local_a68.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows *
       0x10 + lVar33) = dVar47 * (double)((ulong)local_ab0.m_data[lVar26] ^ local_a90._0_8_);
      *(double *)
       ((long)local_a68.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_data +
       local_a68.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows *
       0x20 + lVar33) = dVar40 * local_ab0.m_data[lVar26 + 1];
      *(double *)
       ((long)local_a68.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_data +
       local_a68.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows *
       0x28 + lVar33) = dVar47 * (double)((ulong)local_ab0.m_data[lVar26 + 1] ^ local_a90._0_8_);
      *(double *)
       ((long)local_a68.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_data +
       local_a68.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows *
       0x38 + lVar33) = dVar40 * local_ab0.m_data[lVar26 + 2];
      *(double *)
       ((long)local_a68.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_data +
       local_a68.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows *
       0x40 + lVar33) = dVar47 * (double)((ulong)local_ab0.m_data[lVar26 + 2] ^ local_a90._0_8_);
      *(double *)
       ((long)local_a68.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_data +
       local_a68.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows *
       0x50 + lVar33) = dVar40 * local_ab0.m_data[lVar26 + 3];
      *(double *)
       ((long)local_a68.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_data +
       local_a68.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows *
       0x58 + lVar33) = dVar47 * (double)((ulong)local_ab0.m_data[lVar26 + 3] ^ local_a90._0_8_);
      auVar1._8_8_ = 0;
      auVar1._0_8_ = local_4b8.
                     super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                     m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                     m_storage.m_data;
      auVar44._8_8_ = 0;
      auVar44._0_8_ =
           dVar41 * (double)local_4b8.
                            super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>
                            .m_matrixU.
                            super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                            m_storage.m_cols;
      auVar46._8_8_ = 0;
      auVar46._0_8_ = dVar40;
      auVar38 = vfmsub231sd_fma(auVar44,auVar46,auVar1);
      *(long *)((long)local_a20.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                      m_storage.m_data + lVar33 + -8) = auVar38._0_8_;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = local_4b8.
                     super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                     m_matrixU.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                     m_storage.m_rows;
      auVar45._8_8_ = 0;
      auVar45._0_8_ =
           dVar47 * (double)local_4b8.
                            super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>
                            .m_matrixU.
                            super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                            m_storage.m_cols;
      auVar38 = vfmsub231sd_fma(auVar45,auVar46,auVar2);
      *(long *)((long)local_a20.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                      m_storage.m_data + lVar33) = auVar38._0_8_;
      uVar36 = uVar36 + 1;
      lVar33 = lVar33 + 0x10;
      lVar37 = lVar37 + 0x100000000;
    } while (uVar36 < indices->_numberCorrespondences);
  }
  Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>::JacobiSVD
            (&local_4b8,&local_a68,0x28);
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0] = 5.92878775009496e-323;
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [1] = 5.92878775009496e-323;
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [2] = 0.0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_a38,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)&local_940);
  local_ad0.m_data = (double *)0x0;
  local_ad0.m_rows = 0;
  local_ad0.m_cols = 0;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
            (&local_ad0,
             local_4b8.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>
             .m_singularValues.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
             m_storage.m_rows,
             local_4b8.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>
             .m_singularValues.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
             m_storage.m_rows,1);
  if ((local_ad0.m_rows !=
       local_4b8.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
       m_singularValues.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
       m_rows) || (local_ad0.m_cols != 1)) {
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
              (&local_ad0,
               local_4b8.
               super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
               m_singularValues.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
               m_storage.m_rows,
               local_4b8.
               super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
               m_singularValues.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
               m_storage.m_rows,1);
  }
  uVar35 = local_ad0.m_cols * local_ad0.m_rows;
  uVar36 = uVar35 + 7;
  if (-1 < (long)uVar35) {
    uVar36 = uVar35;
  }
  uVar36 = uVar36 & 0xfffffffffffffff8;
  if (7 < (long)uVar35) {
    lVar33 = 0;
    do {
      *(undefined1 (*) [64])(local_ad0.m_data + lVar33) =
           *(undefined1 (*) [64])
            (local_4b8.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>
             .m_singularValues.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
             m_storage.m_data + lVar33);
      lVar33 = lVar33 + 8;
    } while (lVar33 < (long)uVar36);
  }
  if ((long)uVar36 < (long)uVar35) {
    do {
      local_ad0.m_data[uVar36] =
           local_4b8.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
           m_singularValues.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
           .m_data[uVar36];
      uVar36 = uVar36 + 1;
    } while (uVar35 - uVar36 != 0);
  }
  lVar33 = 0;
  plVar27 = local_a38;
  do {
    auVar49._8_8_ = 0;
    auVar49._0_8_ = local_ad0.m_data[lVar33];
    uVar10 = vcmpsd_avx512f(auVar49,ZEXT816(0x3eb0c6f7a0b5ed8d),0xe);
    *plVar27 = (ulong)((byte)uVar10 & 1) * (long)(1.0 / local_ad0.m_data[lVar33]);
    lVar33 = lVar33 + 1;
    plVar27 = plVar27 + local_a30 + 1;
  } while (lVar33 != 0xc);
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::DenseStorage
            (&local_a50,
             (DenseStorage<double,__1,__1,__1,_0> *)
             &local_4b8.
              super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
              m_matrixV);
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0] = (double)&local_a50;
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [1] = (double)&local_a38;
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [2] = (double)&local_4b8;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>const>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_a08,
             (DenseBase<Eigen::Product<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_Eigen::Transpose<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>_>
              *)&local_940);
  Eigen::internal::
  generic_product_impl<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::DenseShape,Eigen::DenseShape,8>
  ::evalTo<Eigen::Matrix<double,12,1,0,12,1>>(&local_9a0,&local_a08,&local_a20);
  ptVar22 = local_a70;
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0] = *local_a50.m_data;
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [1] = local_a50.m_data[1];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [2] = local_a50.m_data[2];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [3] = local_a50.m_data[3];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [4] = local_a50.m_data[4];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [5] = local_a50.m_data[5];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [6] = local_a50.m_data[6];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [7] = local_a50.m_data[7];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [8] = local_a50.m_data[8];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [9] = local_a50.m_data[9];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [10] = local_a50.m_data[10];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0xb] = local_a50.m_data[0xb];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0xc] = local_a50.m_data[0xc];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0xd] = local_a50.m_data[0xd];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0xe] = local_a50.m_data[0xe];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0xf] = local_a50.m_data[0xf];
  pdVar29 = local_a50.m_data + local_a50.m_rows + 4;
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x10] = *pdVar29;
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x11] = pdVar29[1];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x12] = pdVar29[2];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x13] = pdVar29[3];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x14] = pdVar29[4];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x15] = pdVar29[5];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x16] = pdVar29[6];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x17] = pdVar29[7];
  pdVar29 = local_a50.m_data + local_a50.m_rows * 2;
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x18] = *pdVar29;
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x19] = pdVar29[1];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x1a] = pdVar29[2];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x1b] = pdVar29[3];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x1c] = pdVar29[4];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x1d] = pdVar29[5];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x1e] = pdVar29[6];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x1f] = pdVar29[7];
  pdVar29 = local_a50.m_data + local_a50.m_rows * 2 + 8;
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x20] = *pdVar29;
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x21] = pdVar29[1];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x22] = pdVar29[2];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x23] = pdVar29[3];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x24] = pdVar29[4];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x25] = pdVar29[5];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x26] = pdVar29[6];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x27] = pdVar29[7];
  pdVar29 = local_a50.m_data + local_a50.m_rows * 3 + 4;
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x28] = *pdVar29;
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x29] = pdVar29[1];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x2a] = pdVar29[2];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x2b] = pdVar29[3];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x2c] = pdVar29[4];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x2d] = pdVar29[5];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x2e] = pdVar29[6];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x2f] = pdVar29[7];
  pdVar29 = local_a50.m_data + local_a50.m_rows * 4;
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x30] = *pdVar29;
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x31] = pdVar29[1];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x32] = pdVar29[2];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x33] = pdVar29[3];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x34] = pdVar29[4];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x35] = pdVar29[5];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x36] = pdVar29[6];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x37] = pdVar29[7];
  pdVar29 = local_a50.m_data + local_a50.m_rows * 4 + 8;
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x38] = *pdVar29;
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x39] = pdVar29[1];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x3a] = pdVar29[2];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x3b] = pdVar29[3];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x3c] = pdVar29[4];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x3d] = pdVar29[5];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x3e] = pdVar29[6];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x3f] = pdVar29[7];
  pdVar29 = local_a50.m_data + local_a50.m_rows * 5 + 4;
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x40] = *pdVar29;
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x41] = pdVar29[1];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x42] = pdVar29[2];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x43] = pdVar29[3];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x44] = pdVar29[4];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x45] = pdVar29[5];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x46] = pdVar29[6];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x47] = pdVar29[7];
  pdVar29 = local_a50.m_data + local_a50.m_rows * 6;
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x48] = *pdVar29;
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x49] = pdVar29[1];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x4a] = pdVar29[2];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x4b] = pdVar29[3];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x4c] = pdVar29[4];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x4d] = pdVar29[5];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x4e] = pdVar29[6];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x4f] = pdVar29[7];
  pdVar29 = local_a50.m_data + local_a50.m_rows * 6 + 8;
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x50] = *pdVar29;
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x51] = pdVar29[1];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x52] = pdVar29[2];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x53] = pdVar29[3];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x54] = pdVar29[4];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x55] = pdVar29[5];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x56] = pdVar29[6];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x57] = pdVar29[7];
  pdVar29 = local_a50.m_data + local_a50.m_rows * 7 + 4;
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x58] = *pdVar29;
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x59] = pdVar29[1];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x5a] = pdVar29[2];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x5b] = pdVar29[3];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x5c] = pdVar29[4];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x5d] = pdVar29[5];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x5e] = pdVar29[6];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x5f] = pdVar29[7];
  pdVar29 = local_a50.m_data + local_a50.m_rows * 8;
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x60] = *pdVar29;
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x61] = pdVar29[1];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x62] = pdVar29[2];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [99] = pdVar29[3];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [100] = pdVar29[4];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x65] = pdVar29[5];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x66] = pdVar29[6];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x67] = pdVar29[7];
  pdVar29 = local_a50.m_data + local_a50.m_rows * 8 + 8;
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x68] = *pdVar29;
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x69] = pdVar29[1];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x6a] = pdVar29[2];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x6b] = pdVar29[3];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x6c] = pdVar29[4];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x6d] = pdVar29[5];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x6e] = pdVar29[6];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x6f] = pdVar29[7];
  pdVar29 = local_a50.m_data + local_a50.m_rows * 9 + 4;
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x70] = *pdVar29;
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x71] = pdVar29[1];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x72] = pdVar29[2];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x73] = pdVar29[3];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x74] = pdVar29[4];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x75] = pdVar29[5];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x76] = pdVar29[6];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x77] = pdVar29[7];
  pdVar29 = local_a50.m_data + local_a50.m_rows * 10;
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x78] = *pdVar29;
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x79] = pdVar29[1];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x7a] = pdVar29[2];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x7b] = pdVar29[3];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x7c] = pdVar29[4];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x7d] = pdVar29[5];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x7e] = pdVar29[6];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x7f] = pdVar29[7];
  pdVar29 = local_a50.m_data + local_a50.m_rows * 10 + 8;
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x80] = *pdVar29;
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x81] = pdVar29[1];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x82] = pdVar29[2];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x83] = pdVar29[3];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x84] = pdVar29[4];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x85] = pdVar29[5];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x86] = pdVar29[6];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x87] = pdVar29[7];
  pdVar29 = local_a50.m_data + local_a50.m_rows * 0xb + 4;
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x88] = *pdVar29;
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x89] = pdVar29[1];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x8a] = pdVar29[2];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x8b] = pdVar29[3];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x8c] = pdVar29[4];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x8d] = pdVar29[5];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x8e] = pdVar29[6];
  local_940.super_PlainObjectBase<Eigen::Matrix<double,_12,_12,_0,_12,_12>_>.m_storage.m_data.array
  [0x8f] = pdVar29[7];
  modules::gpnp_main(&local_9a0,&local_940,&local_b10,local_a70);
  if (local_a08.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data !=
      (double *)0x0) {
    free((void *)local_a08.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_data[-1]);
  }
  if (local_a50.m_data != (double *)0x0) {
    free((void *)local_a50.m_data[-1]);
  }
  if (local_ad0.m_data != (double *)0x0) {
    free((void *)local_ad0.m_data[-1]);
  }
  if (local_a38 != (long *)0x0) {
    free((void *)local_a38[-1]);
  }
  Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>::~JacobiSVD(&local_4b8);
  if (local_a20.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data !=
      (double *)0x0) {
    free((void *)local_a20.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_data[-1]);
  }
  if (local_a68.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data !=
      (double *)0x0) {
    free((void *)local_a68.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_data[-1]);
  }
  if (local_ab0.m_data != (double *)0x0) {
    free((void *)local_ab0.m_data[-1]);
  }
  if (local_b10.
      super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    free((void *)local_b10.
                 super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[-1].
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
                 [2]);
  }
  Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>::~JacobiSVD(&local_298);
  if ((double *)local_af0._0_8_ != (double *)0x0) {
    free(*(void **)(local_af0._0_8_ + -8));
  }
  return ptVar22;
}

Assistant:

transformation_t gpnp(
    const AbsoluteAdapterBase & adapter,
    const Indices & indices )
{
  assert( indices.size() > 5 );

  //compute the centroid
  point_t c0 = Eigen::Vector3d::Zero();
  for( size_t i = 0; i < indices.size(); i++ )
    c0 = c0 + adapter.getPoint(indices[i]);
  c0 = c0 / indices.size();

  //compute the point-cloud
  Eigen::MatrixXd p(3,indices.size());
  for( size_t i = 0; i < indices.size(); i++ )
    p.col(i) = adapter.getPoint(indices[i]) - c0;

  //compute the moment
  Eigen::JacobiSVD< Eigen::MatrixXd > SVD(
      p,
      Eigen::ComputeThinU | Eigen::ComputeThinV );

  //define the control points
  points_t c;
  c.push_back(c0);
  //c.push_back(c0 + SVD.singularValues()[0] * SVD.matrixU().col(0));
  //c.push_back(c0 + SVD.singularValues()[1] * SVD.matrixU().col(1));
  //c.push_back(c0 + SVD.singularValues()[2] * SVD.matrixU().col(2));
  c.push_back(c0 + 15.0 * SVD.matrixU().col(0));
  c.push_back(c0 + 15.0 * SVD.matrixU().col(1));
  c.push_back(c0 + 15.0 * SVD.matrixU().col(2));

  //derive the barycentric frame
  Eigen::Vector3d e1 = c[1]-c0;
  double e1dote1 = e1.dot(e1);
  Eigen::Vector3d e2 = c[2]-c0;
  double e2dote2 = e2.dot(e2);
  Eigen::Vector3d e3 = c[3]-c0;
  double e3dote3 = e3.dot(e3);

  //derive the weighting factors
  Eigen::MatrixXd weights(4,indices.size());
  for( size_t i = 0; i < indices.size(); i++ )
  {
    Eigen::Vector3d temp = p.col(i);
    weights(1,i) = temp.dot(e1)/e1dote1;
    weights(2,i) = temp.dot(e2)/e2dote2;
    weights(3,i) = temp.dot(e3)/e3dote3;
    weights(0,i) = 1.0-(weights(1,i)+weights(2,i)+weights(3,i));
  }

  //setup matrix A and vector b
  Eigen::MatrixXd A = Eigen::MatrixXd::Zero(2*indices.size(),12);
  Eigen::MatrixXd b = Eigen::MatrixXd::Zero(2*indices.size(),1);
  for( size_t i = 0; i < indices.size(); i++ )
  {
    translation_t camOffset = adapter.getCamOffset(indices[i]);
    rotation_t camRotation = adapter.getCamRotation(indices[i]);
    //respect the rotation
    bearingVector_t f = camRotation * adapter.getBearingVector(indices[i]);

    A(2*i,0)  =  weights(0,i)*f[2];
    A(2*i,2)  = -weights(0,i)*f[0];
    A(2*i,3)  =  weights(1,i)*f[2];
    A(2*i,5)  = -weights(1,i)*f[0];
    A(2*i,6)  =  weights(2,i)*f[2];
    A(2*i,8)  = -weights(2,i)*f[0];
    A(2*i,9)  =  weights(3,i)*f[2];
    A(2*i,11) = -weights(3,i)*f[0];

    A(2*i+1,1)  =  weights(0,i)*f[2];
    A(2*i+1,2)  = -weights(0,i)*f[1];
    A(2*i+1,4)  =  weights(1,i)*f[2];
    A(2*i+1,5)  = -weights(1,i)*f[1];
    A(2*i+1,7)  =  weights(2,i)*f[2];
    A(2*i+1,8)  = -weights(2,i)*f[1];
    A(2*i+1,10) =  weights(3,i)*f[2];
    A(2*i+1,11) = -weights(3,i)*f[1];

    b(2*i,0)   = f[2]*camOffset[0]-f[0]*camOffset[2];
    b(2*i+1,0) = f[2]*camOffset[1]-f[1]*camOffset[2];
  }

  //computing the SVD
  Eigen::JacobiSVD< Eigen::MatrixXd > SVD2(
      A,
      Eigen::ComputeThinV | Eigen::ComputeThinU );

  //computing the pseudoinverse
  Eigen::MatrixXd invD = Eigen::MatrixXd::Zero(12,12);
  Eigen::MatrixXd D = SVD2.singularValues();
  for( size_t i = 0; i < 12; i++ )
  {
    if( D(i,0) > 1.e-6 )
      invD(i,i) = 1.0/D(i,0);
    else
      invD(i,i) = 0.0;
  }

  //Extract the nullsapce vectors;
  Eigen::MatrixXd V = SVD2.matrixV();

  //computing the nullspace intercept
  Eigen::MatrixXd pinvA = V * invD * SVD2.matrixU().transpose();

  //compute the intercept
  Eigen::Matrix<double,12,1> a = pinvA * b;

  //compute the solution
  transformation_t transformation;
  modules::gpnp_main( a, V, c, transformation );
  return transformation;
}